

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesVFManagementGetVFEngineUtilizationExp
          (zes_vf_handle_t hVFhandle,uint32_t *pCount,zes_vf_util_engine_exp_t *pEngineUtil)

{
  zes_pfnVFManagementGetVFEngineUtilizationExp_t pfnGetVFEngineUtilizationExp;
  ze_result_t result;
  zes_vf_util_engine_exp_t *pEngineUtil_local;
  uint32_t *pCount_local;
  zes_vf_handle_t hVFhandle_local;
  
  pfnGetVFEngineUtilizationExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ce28 != (code *)0x0) {
    pfnGetVFEngineUtilizationExp._4_4_ = (*DAT_0011ce28)(hVFhandle,pCount,pEngineUtil);
  }
  return pfnGetVFEngineUtilizationExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFEngineUtilizationExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        uint32_t* pCount,                               ///< [in,out] Pointer to the number of VF engine stats descriptors.
                                                        ///<  - if count is zero, the driver shall update the value with the total
                                                        ///< number of engine stats available.
                                                        ///<  - if count is greater than the total number of engine stats
                                                        ///< available, the driver shall update the value with the correct number
                                                        ///< of engine stats available.
                                                        ///<  - The count returned is the sum of number of VF instances currently
                                                        ///< available and the PF instance.
        zes_vf_util_engine_exp_t* pEngineUtil           ///< [in,out][optional][range(0, *pCount)] array of engine group activity counters.
                                                        ///<  - if count is less than the total number of engine stats available,
                                                        ///< then driver shall only retrieve that number of stats.
                                                        ///<  - the implementation shall populate the vector pCount-1 number of VF
                                                        ///< engine stats.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetVFEngineUtilizationExp = context.zesDdiTable.VFManagementExp.pfnGetVFEngineUtilizationExp;
        if( nullptr != pfnGetVFEngineUtilizationExp )
        {
            result = pfnGetVFEngineUtilizationExp( hVFhandle, pCount, pEngineUtil );
        }
        else
        {
            // generic implementation
        }

        return result;
    }